

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCDPP.h
# Opt level: O2

void __thiscall CCDPP::predict_test_data(CCDPP *this)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"RMSE of testing data: ",&local_31);
  predict(this,&this->test_ratings,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void predict_test_data() {
        predict(test_ratings, "RMSE of testing data: ");
    }